

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  BYTE *pBVar1;
  byte bVar2;
  BYTE BVar3;
  undefined8 uVar4;
  ushort uVar5;
  BYTE *s;
  BYTE *pBVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pBVar10;
  uint uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *d_2;
  size_t __n;
  ushort *puVar17;
  ushort *puVar18;
  BYTE *d;
  BYTE *pBVar19;
  int local_48;
  BYTE *local_38;
  
  if (source == (char *)0x0) {
    uVar9 = 0xffffffff;
  }
  else if (originalSize == 0) {
    uVar9 = -(uint)(*source != '\0') | 1;
  }
  else {
    pBVar1 = (BYTE *)(dest + originalSize);
    pBVar16 = (BYTE *)(dest + (long)originalSize + -8);
    pBVar13 = (BYTE *)(dest + (long)originalSize + -0x1a);
    local_48 = (int)source;
    if (0x3f < originalSize) {
      do {
        while( true ) {
          bVar2 = (byte)*(ushort *)source;
          uVar11 = (uint)bVar2;
          uVar9 = (uint)(bVar2 >> 4);
          if (uVar9 == 0xf) {
            uVar9 = 0;
            puVar18 = (ushort *)((long)source + 0x10);
            do {
              puVar17 = puVar18;
              uVar9 = uVar9 + *(byte *)((long)puVar17 + -0xf);
              puVar18 = (ushort *)((long)puVar17 + 1);
            } while (*(byte *)((long)puVar17 + -0xf) == 0xff);
            uVar8 = (ulong)uVar9;
            pBVar19 = (BYTE *)dest + uVar8 + 0xf;
            if (pBVar16 < pBVar19) {
              __n = uVar8 + 0xf;
              source = (char *)(puVar17 + -7);
              goto LAB_0011638b;
            }
            puVar18 = puVar17 + -7;
            do {
              *(undefined8 *)dest = *(undefined8 *)puVar18;
              dest = (char *)((BYTE *)dest + 8);
              puVar18 = puVar18 + 4;
            } while (dest < pBVar19);
            puVar18 = (ushort *)((long)puVar17 + 1 + uVar8);
          }
          else {
            *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
            if (0x8f < bVar2) {
              *(undefined8 *)((BYTE *)dest + 8) = *(undefined8 *)((long)source + 9);
            }
            pBVar19 = (BYTE *)dest + uVar9;
            puVar18 = (ushort *)((byte *)((long)source + 1) + uVar9);
          }
          uVar7 = *puVar18;
          uVar8 = (ulong)uVar7;
          source = (char *)(puVar18 + 1);
          pBVar14 = pBVar19 + -uVar8;
          uVar12 = (ulong)(bVar2 & 0xf);
          if (uVar12 != 0xf) break;
          uVar9 = 0;
          do {
            uVar5 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar9 = uVar9 + (byte)uVar5;
          } while ((byte)uVar5 == 0xff);
          dest = (char *)(pBVar19 + (ulong)uVar9 + 0x13);
          if (pBVar1 + -0x40 <= dest) {
            uVar12 = (ulong)uVar9 + 0x13;
            goto LAB_001163e3;
          }
          if (uVar7 < 0x10) {
LAB_001162a2:
            LZ4_memcpy_using_offset(pBVar19,pBVar14,(BYTE *)dest,uVar8);
          }
          else {
            do {
              uVar4 = *(undefined8 *)(pBVar19 + -uVar8 + 8);
              *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar19 + -uVar8);
              *(undefined8 *)(pBVar19 + 8) = uVar4;
              uVar4 = *(undefined8 *)(pBVar19 + -uVar8 + 0x10 + 8);
              *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar19 + -uVar8 + 0x10);
              *(undefined8 *)(pBVar19 + 0x18) = uVar4;
              pBVar19 = pBVar19 + 0x20;
            } while (pBVar19 < dest);
          }
        }
        dest = (char *)(pBVar19 + uVar12 + 4);
        if (pBVar1 + -0x40 <= dest) {
          uVar12 = uVar12 + 4;
          goto LAB_001163e3;
        }
        if (uVar7 < 8) goto LAB_001162a2;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar14 + 8);
        *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
      } while( true );
    }
    while( true ) {
      bVar2 = (byte)*(ushort *)source;
      source = (char *)((long)source + 1);
      while( true ) {
        uVar11 = (uint)bVar2;
        __n = (size_t)(uint)(bVar2 >> 4);
        if ((0x8f < uVar11) || (pBVar13 < dest)) break;
        *(undefined8 *)dest = *(undefined8 *)source;
        pBVar19 = (BYTE *)dest + __n;
        uVar12 = (ulong)(uVar11 & 0xf);
        puVar18 = (ushort *)((long)source + __n);
        uVar7 = *puVar18;
        pBVar14 = pBVar19 + -(ulong)uVar7;
        if (((uVar11 & 0xf) == 0xf) || (uVar7 < 8)) goto LAB_001163bf;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar14 + 8);
        *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
        dest = (char *)(pBVar19 + uVar12 + 4);
        bVar2 = *(byte *)((long)source + __n + 2);
        source = (char *)((long)source + __n + 3);
      }
      if (bVar2 >> 4 == 0xf) {
        uVar9 = 0;
        do {
          uVar7 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar9 = uVar9 + (byte)uVar7;
        } while ((byte)uVar7 == 0xff);
        __n = (ulong)uVar9 + 0xf;
      }
      pBVar19 = (BYTE *)dest + __n;
LAB_0011638b:
      puVar18 = (ushort *)source;
      if (pBVar16 < pBVar19) break;
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar18;
        dest = (char *)((BYTE *)dest + 8);
        puVar18 = puVar18 + 4;
      } while (dest < pBVar19);
      puVar18 = (ushort *)((long)source + __n);
      uVar7 = *puVar18;
      pBVar14 = pBVar19 + -(ulong)uVar7;
      uVar12 = (ulong)(uVar11 & 0xf);
LAB_001163bf:
      source = (char *)(puVar18 + 1);
      if ((int)uVar12 == 0xf) {
        uVar9 = 0;
        do {
          uVar5 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar9 = uVar9 + (byte)uVar5;
        } while ((byte)uVar5 == 0xff);
        uVar12 = (ulong)uVar9 + 0xf;
      }
      uVar12 = uVar12 + 4;
LAB_001163e3:
      dest = (char *)(pBVar19 + uVar12);
      if (uVar7 < 8) {
        LZ4_decompress_fast_cold_1();
        pBVar14 = local_38;
      }
      else {
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
        pBVar14 = pBVar14 + 8;
      }
      pBVar6 = pBVar19 + 8;
      if (pBVar1 + -0xc < dest) {
        if (pBVar1 + -5 < dest) goto LAB_0011644e;
        pBVar19 = pBVar1 + -7;
        pBVar10 = pBVar14;
        pBVar15 = pBVar6;
        if (pBVar6 < pBVar19) {
          do {
            *(undefined8 *)pBVar15 = *(undefined8 *)pBVar10;
            pBVar15 = pBVar15 + 8;
            pBVar10 = pBVar10 + 8;
          } while (pBVar15 < pBVar19);
          pBVar14 = pBVar14 + ((long)pBVar19 - (long)pBVar6);
          pBVar6 = pBVar19;
        }
        for (; pBVar6 < dest; pBVar6 = pBVar6 + 1) {
          BVar3 = *pBVar14;
          pBVar14 = pBVar14 + 1;
          *pBVar6 = BVar3;
        }
      }
      else {
        *(undefined8 *)pBVar6 = *(undefined8 *)pBVar14;
        if (0x10 < uVar12) {
          pBVar19 = pBVar19 + 0x10;
          do {
            pBVar14 = pBVar14 + 8;
            *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
            pBVar19 = pBVar19 + 8;
          } while (pBVar19 < dest);
        }
      }
    }
    if (pBVar19 == pBVar1) {
      memmove(dest,source,__n);
      return ((int)source + (int)__n) - local_48;
    }
LAB_0011644e:
    uVar9 = ~(uint)source + local_48;
  }
  return uVar9;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}